

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemView::closePersistentEditor(QAbstractItemView *this,QModelIndex *index)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  QWidget *this_01;
  QEditorInfo *pQVar3;
  long *plVar4;
  long in_FS_OFFSET;
  QWidget *editor;
  undefined8 local_60;
  quintptr local_58;
  QAbstractItemModel *local_50;
  QWidget *local_48;
  void *local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  pQVar3 = QAbstractItemViewPrivate::editorForIndex(this_00,index);
  pDVar1 = (pQVar3->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    local_48 = (QWidget *)0x0;
  }
  else {
    local_48 = (QWidget *)(pQVar3->widget).wp.value;
  }
  if (local_48 != (QWidget *)0x0) {
    QItemSelectionModel::currentIndex();
    if ((((index->r == (int)local_60) && (index->c == local_60._4_4_)) && (index->i == local_58)) &&
       ((index->m).ptr == local_50)) {
      (**(code **)(*(long *)this + 0x290))(this,local_48,4);
    }
    QHash<QWidget*,QHashDummyValue>::removeImpl<QWidget*>
              ((QHash<QWidget*,QHashDummyValue> *)&this_00->persistent,&local_48);
    QAbstractItemViewPrivate::removeEditor(this_00,local_48);
    this_01 = local_48;
    if (local_48 != (QWidget *)0x0) {
      pQVar2 = *(QObject **)
                &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                 super_QWidgetPrivate.field_0x8;
      local_60 = QObject::destroyed;
      local_58 = 0;
      local_40 = (void *)0x2a1;
      local_38 = 0;
      QObject::disconnectImpl
                (&local_48->super_QObject,(void **)&local_60,pQVar2,&local_40,
                 (QMetaObject *)&QObject::staticMetaObject);
      QObject::removeEventFilter(&this_01->super_QObject);
      QWidget::hide(this_01);
      plVar4 = (long *)(**(code **)(*(long *)pQVar2 + 0x208))(pQVar2,index);
      if (plVar4 == (long *)0x0) {
        QObject::deleteLater();
      }
      else {
        (**(code **)(*plVar4 + 0x78))(plVar4,this_01,index);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::closePersistentEditor(const QModelIndex &index)
{
    Q_D(QAbstractItemView);
    if (QWidget *editor = d->editorForIndex(index).widget.data()) {
        if (index == selectionModel()->currentIndex())
            closeEditor(editor, QAbstractItemDelegate::RevertModelCache);
        d->persistent.remove(editor);
        d->removeEditor(editor);
        d->releaseEditor(editor, index);
    }
}